

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.hpp
# Opt level: O0

XMLCh * __thiscall xercesc_4_0::TraverseSchema::getPrefix(TraverseSchema *this,XMLCh *rawName)

{
  XMLStringPool *pXVar1;
  XMLStringPool *pXVar2;
  int iVar3;
  uint uVar4;
  XMLCh *pXVar5;
  undefined4 extraout_var;
  int colonIndex;
  XMLCh *rawName_local;
  TraverseSchema *this_local;
  
  iVar3 = XMLString::indexOf(rawName,L':');
  if ((iVar3 == -1) || (iVar3 == 0)) {
    this_local = (TraverseSchema *)&XMLUni::fgZeroLenString;
  }
  else {
    XMLBuffer::set(&this->fBuffer,rawName,(long)iVar3);
    pXVar1 = this->fStringPool;
    pXVar2 = this->fStringPool;
    pXVar5 = XMLBuffer::getRawBuffer(&this->fBuffer);
    uVar4 = (*(pXVar2->super_XSerializable)._vptr_XSerializable[5])(pXVar2,pXVar5);
    iVar3 = (*(pXVar1->super_XSerializable)._vptr_XSerializable[10])(pXVar1,(ulong)uVar4);
    this_local = (TraverseSchema *)CONCAT44(extraout_var,iVar3);
  }
  return (XMLCh *)this_local;
}

Assistant:

inline const XMLCh* TraverseSchema::getPrefix(const XMLCh* const rawName) {

    int colonIndex = XMLString::indexOf(rawName, chColon);

    if (colonIndex == -1 || colonIndex == 0) {
        return XMLUni::fgZeroLenString;
    }

    fBuffer.set(rawName, colonIndex);

    return fStringPool->getValueForId(fStringPool->addOrFind(fBuffer.getRawBuffer()));
}